

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mapperUtils.c
# Opt level: O2

void Map_MappingSetupTruthTables(uint (*uTruths) [2])

{
  uint uVar1;
  long lVar2;
  
  for (uVar1 = 0; uVar1 != 0x20; uVar1 = uVar1 + 1) {
    for (lVar2 = 0; lVar2 != 5; lVar2 = lVar2 + 1) {
      if ((uVar1 >> ((uint)lVar2 & 0x1f) & 1) != 0) {
        uTruths[lVar2][0] = uTruths[lVar2][0] | 1 << ((byte)uVar1 & 0x1f);
      }
    }
  }
  for (lVar2 = 0; lVar2 != 5; lVar2 = lVar2 + 1) {
    uTruths[lVar2][1] = uTruths[lVar2][0];
  }
  uTruths[5] = (uint  [2])0xffffffff00000000;
  return;
}

Assistant:

void Map_MappingSetupTruthTables( unsigned uTruths[][2] )
{
    int m, v;
    // set up the truth tables
    for ( m = 0; m < 32; m++ )
        for ( v = 0; v < 5; v++ )
            if ( m & (1 << v) )
                uTruths[v][0] |= (1 << m);
    // make adjustments for the case of 6 variables
    for ( v = 0; v < 5; v++ )
        uTruths[v][1] = uTruths[v][0];
    uTruths[5][0] = 0;
    uTruths[5][1] = MAP_FULL;
}